

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.h
# Opt level: O2

void __thiscall
psql::
channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::read<psql::authentication_request>
          (channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *this,authentication_request *msg,bytestring *buffer)

{
  pointer puVar1;
  runtime_error *this_00;
  size_t in_RCX;
  long lVar2;
  uint8_t *first;
  uint8_t msg_type;
  error_info local_58;
  error_code err;
  deserialization_context ctx;
  
  msg_type = '\0';
  read(this,(int)buffer,&msg_type,in_RCX);
  if (msg_type == 'R') {
    puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    first = (uint8_t *)0x0;
    if (lVar2 != 0) {
      first = puVar1;
    }
    deserialization_context::deserialization_context(&ctx,first,first + lVar2);
    err = deserialize_message<psql::authentication_request>(msg,&ctx);
    local_58.msg_._M_dataplus._M_p = (pointer)&local_58.msg_.field_2;
    local_58.msg_.field_2._M_allocated_capacity = 0;
    local_58.msg_.field_2._8_8_ = 0;
    local_58.msg_._M_string_length = 0;
    check_error_code(&err,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected msg type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read(Message& msg, bytestring& buffer)
	{
		std::uint8_t msg_type = 0;
		read(buffer, msg_type);
		if (msg_type != Message::message_type) throw std::runtime_error("Unexpected msg type");
		deserialization_context ctx (boost::asio::buffer(buffer));
		auto err = deserialize_message(msg, ctx);
		check_error_code(err, error_info());
	}